

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void WriteIndentChar(TidyDocImpl *doc)

{
  uint uVar1;
  uint uVar2;
  int spaces;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (doc->pprint).indent[0].spaces;
  if ((int)uVar1 < 1) {
    return;
  }
  uVar2 = *(uint *)((doc->config).value + 0x53);
  uVar3 = uVar1;
  if (uVar2 != 0 && doc->indent_char == 9) {
    uVar3 = uVar1 / uVar2;
    uVar4 = 1;
    if (uVar1 < uVar2) goto LAB_0014a059;
  }
  uVar4 = uVar3;
  if (uVar3 == 0) {
    return;
  }
LAB_0014a059:
  do {
    prvTidyWriteChar(doc->indent_char,doc->docOut);
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  return;
}

Assistant:

static void WriteIndentChar(TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;
    uint spaces = GetSpaces(pprint);
    uint tabsize = cfg(doc, TidyTabSize);
    if (spaces && (doc->indent_char == '\t') && tabsize)
    {
        spaces /= tabsize;  /* set number of tabs to output */
        if (spaces == 0)    /* with a minimum of one */
            spaces = 1;
    }
    for (i = 0; i < spaces; i++)
        TY_(WriteChar)(doc->indent_char, doc->docOut); /* 20150515 - Issue #108 */

}